

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.cpp
# Opt level: O0

Side banksia::string2Side(string *s)

{
  bool bVar1;
  string *in_RDI;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  Side local_14;
  
  toLower(in_RDI);
  local_14 = black;
  while( true ) {
    if (*(long *)(sideStrings + (long)(int)local_14 * 8) == 0) {
      return none;
    }
    bVar1 = std::operator==((char *)in_RDI,in_stack_ffffffffffffffd8);
    if ((bVar1) || (bVar1 = std::operator==((char *)in_RDI,in_stack_ffffffffffffffd8), bVar1))
    break;
    local_14 = local_14 + white;
  }
  return local_14;
}

Assistant:

Side string2Side(std::string s)
    {
        toLower(s);
        for(int i = 0; sideStrings[i]; i++) {
            if (sideStrings[i] == s || shortSideStrings[i] == s) {
                return static_cast<Side>(i);
            }
        }
        return Side::none;

    }